

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

int __thiscall
ImGui::DataTypeFormatString
          (ImGui *this,char *buf,int buf_size,ImGuiDataType data_type,void *p_data,char *format)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined4 in_register_0000000c;
  double *pdVar4;
  double dVar5;
  
  pdVar4 = (double *)CONCAT44(in_register_0000000c,data_type);
  uVar1 = buf_size & 0xfffffffe;
  uVar3 = (ulong)uVar1;
  iVar2 = (int)buf;
  if (uVar1 == 6) {
    iVar2 = ImFormatString((char *)this,(long)iVar2,(char *)p_data,*pdVar4);
    return iVar2;
  }
  if (uVar1 == 4) {
    uVar3 = (ulong)(uint)*(float *)pdVar4;
    goto LAB_001dbd7c;
  }
  if (9 < (uint)buf_size) {
switchD_001dbdab_caseD_4:
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x6db,"DataTypeFormatString","ImGui ASSERT FAILED: %s","0",format,uVar3);
    return 0;
  }
  uVar3 = (long)&switchD_001dbdab::switchdataD_002857c0 +
          (long)(int)(&switchD_001dbdab::switchdataD_002857c0)[(uint)buf_size];
  switch(buf_size) {
  case 0:
    uVar3 = (ulong)(uint)(int)*(char *)pdVar4;
    break;
  case 1:
    uVar3 = (ulong)*(byte *)pdVar4;
    break;
  case 2:
    uVar3 = (ulong)(uint)(int)*(short *)pdVar4;
    break;
  case 3:
    uVar3 = (ulong)*(ushort *)pdVar4;
    break;
  default:
    goto switchD_001dbdab_caseD_4;
  case 8:
    dVar5 = (double)*(float *)pdVar4;
    goto LAB_001dbe0d;
  case 9:
    dVar5 = *pdVar4;
LAB_001dbe0d:
    iVar2 = ImFormatString((char *)this,(long)iVar2,(char *)p_data,dVar5);
    return iVar2;
  }
LAB_001dbd7c:
  iVar2 = ImFormatString((char *)this,(long)iVar2,(char *)p_data,uVar3);
  return iVar2;
}

Assistant:

int ImGui::DataTypeFormatString(char* buf, int buf_size, ImGuiDataType data_type, const void* p_data, const char* format)
{
    // Signedness doesn't matter when pushing integer arguments
    if (data_type == ImGuiDataType_S32 || data_type == ImGuiDataType_U32)
        return ImFormatString(buf, buf_size, format, *(const ImU32*)p_data);
    if (data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
        return ImFormatString(buf, buf_size, format, *(const ImU64*)p_data);
    if (data_type == ImGuiDataType_Float)
        return ImFormatString(buf, buf_size, format, *(const float*)p_data);
    if (data_type == ImGuiDataType_Double)
        return ImFormatString(buf, buf_size, format, *(const double*)p_data);
    if (data_type == ImGuiDataType_S8)
        return ImFormatString(buf, buf_size, format, *(const ImS8*)p_data);
    if (data_type == ImGuiDataType_U8)
        return ImFormatString(buf, buf_size, format, *(const ImU8*)p_data);
    if (data_type == ImGuiDataType_S16)
        return ImFormatString(buf, buf_size, format, *(const ImS16*)p_data);
    if (data_type == ImGuiDataType_U16)
        return ImFormatString(buf, buf_size, format, *(const ImU16*)p_data);
    IM_ASSERT(0);
    return 0;
}